

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

Path * kj::Path::parse(Path *__return_storage_ptr__,StringPtr path)

{
  bool bVar1;
  size_t sVar2;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  char *in_R8;
  StringPtr path_00;
  StringPtr path_01;
  StringPtr path_local;
  Fault f;
  
  path_local.content.size_ = path.content.size_;
  path_local.content.ptr = path.content.ptr;
  f.exception = (Exception *)0x57c7b0;
  bVar1 = StringPtr::startsWith(&path_local,(StringPtr *)&f);
  sVar2 = extraout_RDX;
  if (bVar1) {
    in_R8 = "!path.startsWith(\"/\")";
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[39],kj::StringPtr&>
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
               ,0x35,FAILED,"!path.startsWith(\"/\")",
               "\"expected a relative path, got absolute\", path",
               (char (*) [39])"expected a relative path, got absolute",&path_local);
    kj::_::Debug::Fault::~Fault(&f);
    sVar2 = extraout_RDX_00;
  }
  path_00.content.size_ = sVar2;
  path_00.content.ptr = (char *)path_local.content.size_;
  sVar2 = countParts((Path *)path_local.content.ptr,path_00);
  f.exception = (Exception *)kj::_::HeapArrayDisposer::allocateUninitialized<kj::String>(sVar2);
  path_01.content.size_ = (size_t)in_R8;
  path_01.content.ptr = (char *)path_local.content.size_;
  evalImpl(__return_storage_ptr__,(Path *)&f,(Vector<kj::String> *)path_local.content.ptr,path_01);
  ArrayBuilder<kj::String>::dispose((ArrayBuilder<kj::String> *)&f);
  return __return_storage_ptr__;
}

Assistant:

Path Path::parse(StringPtr path) {
  KJ_REQUIRE(!path.startsWith("/"), "expected a relative path, got absolute", path) {
    // When exceptions are disabled, go on -- the leading '/' will end up ignored.
    break;
  }
  return evalImpl(Vector<String>(countParts(path)), path);
}